

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::GoGenerator
          (GoGenerator *this,Parser *parser,string *path,string *file_name,string *go_namespace)

{
  _Rb_tree_header *p_Var1;
  istream *piVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_6ab;
  allocator<char> local_6aa;
  allocator<char> local_6a9;
  allocator<char> local_6a8;
  allocator<char> local_6a7;
  allocator<char> local_6a6;
  allocator<char> local_6a5;
  allocator<char> local_6a4;
  allocator_type local_6a3;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_6a2;
  allocator<char> local_6a1;
  allocator<char> local_6a0;
  allocator<char> local_69f;
  allocator<char> local_69e;
  allocator<char> local_69d;
  allocator<char> local_69c;
  allocator<char> local_69b;
  allocator<char> local_69a;
  allocator<char> local_699;
  allocator<char> local_698;
  allocator<char> local_697;
  allocator<char> local_696;
  allocator<char> local_695;
  allocator<char> local_694;
  allocator<char> local_693;
  allocator<char> local_692;
  allocator<char> local_691;
  string *local_690;
  string local_688;
  string local_668;
  string local_648;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_628;
  string component;
  string local_5d8 [32];
  undefined8 local_5b8;
  string local_5b0 [32];
  string local_590 [32];
  string local_570 [32];
  string local_550 [32];
  string local_530 [32];
  undefined8 local_510;
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [40];
  istringstream iss;
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  Config local_180;
  
  local_690 = go_namespace;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,"",(allocator<char> *)&iss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_688,"",(allocator<char> *)&component);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"go",&local_6ab);
  BaseGenerator::BaseGenerator
            (&this->super_BaseGenerator,parser,path,file_name,&local_668,&local_688,&local_648);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_668);
  (this->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_002fa6e8;
  this->cur_name_space_ = (Namespace *)0x0;
  (this->go_namespace_).components.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->go_namespace_).components.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->go_namespace_).components.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->go_namespace_).from_table = 0;
  component._M_dataplus._M_p = (pointer)0x8;
  component._M_string_length = 0x100000001;
  component.field_2._M_allocated_capacity = 0x200000001;
  component.field_2._8_4_ = 8;
  std::__cxx11::string::string<std::allocator<char>>(local_5d8,"",(allocator<char> *)&iss);
  local_5b8._0_4_ = AfterConvertingCase;
  local_5b8._4_4_ = kKeep;
  std::__cxx11::string::string<std::allocator<char>>(local_5b0,"__",&local_6ab);
  std::__cxx11::string::string<std::allocator<char>>(local_590,"",&local_6a4);
  std::__cxx11::string::string<std::allocator<char>>(local_570,"T",&local_6a5);
  std::__cxx11::string::string<std::allocator<char>>(local_550,"",&local_6a6);
  std::__cxx11::string::string<std::allocator<char>>(local_530,"_",&local_6a7);
  local_510._0_4_ = kKeep;
  local_510._4_4_ = kKeep;
  std::__cxx11::string::string<std::allocator<char>>(local_508,"",&local_6a8);
  std::__cxx11::string::string<std::allocator<char>>(local_4e8,"",&local_6a9);
  std::__cxx11::string::string<std::allocator<char>>(local_4c8,".go",&local_6aa);
  WithFlagOptions(&local_180,(Config *)&component,&parser->opts,path);
  std::__cxx11::string::string<std::allocator<char>>((string *)&iss,"break",&local_6ab);
  std::__cxx11::string::string<std::allocator<char>>(local_480,"default",&local_6a4);
  std::__cxx11::string::string<std::allocator<char>>(local_460,"func",&local_6a5);
  std::__cxx11::string::string<std::allocator<char>>(local_440,"interface",&local_6a6);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"select",&local_6a7);
  std::__cxx11::string::string<std::allocator<char>>(local_400,"case",&local_6a8);
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"defer",&local_6a9);
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,"go",&local_6aa);
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"map",&local_691);
  std::__cxx11::string::string<std::allocator<char>>(local_380,"struct",&local_692);
  std::__cxx11::string::string<std::allocator<char>>(local_360,"chan",&local_693);
  std::__cxx11::string::string<std::allocator<char>>(local_340,"else",&local_694);
  std::__cxx11::string::string<std::allocator<char>>(local_320,"goto",&local_695);
  std::__cxx11::string::string<std::allocator<char>>(local_300,"package",&local_696);
  std::__cxx11::string::string<std::allocator<char>>(local_2e0,"switch",&local_697);
  std::__cxx11::string::string<std::allocator<char>>(local_2c0,"const",&local_698);
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"fallthrough",&local_699);
  std::__cxx11::string::string<std::allocator<char>>(local_280,"if",&local_69a);
  std::__cxx11::string::string<std::allocator<char>>(local_260,"range",&local_69b);
  std::__cxx11::string::string<std::allocator<char>>(local_240,"type",&local_69c);
  std::__cxx11::string::string<std::allocator<char>>(local_220,"continue",&local_69d);
  std::__cxx11::string::string<std::allocator<char>>(local_200,"for",&local_69e);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"import",&local_69f);
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"return",&local_6a0);
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"var",&local_6a1);
  __l._M_len = 0x19;
  __l._M_array = (iterator)&iss;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_628,__l,&local_6a2,&local_6a3);
  lVar3 = 0x300;
  do {
    std::__cxx11::string::~string((string *)(&iss + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  IdlNamer::IdlNamer(&this->namer_,&local_180,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_628);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_628);
  Namer::Config::~Config(&local_180);
  Namer::Config::~Config((Config *)&component);
  p_Var1 = &(this->tracked_imported_namespaces_)._M_t._M_impl.super__Rb_tree_header;
  (this->tracked_imported_namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->tracked_imported_namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->tracked_imported_namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->tracked_imported_namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->tracked_imported_namespaces_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->needs_math_import_ = false;
  this->needs_bytes_import_ = false;
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)local_690,_S_in);
  component._M_dataplus._M_p = (pointer)&component.field_2;
  component._M_string_length = 0;
  component.field_2._M_allocated_capacity =
       component.field_2._M_allocated_capacity & 0xffffffffffffff00;
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&iss,(string *)&component,'.');
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->go_namespace_).components,&component);
  }
  std::__cxx11::string::~string((string *)&component);
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  return;
}

Assistant:

GoGenerator(const Parser &parser, const std::string &path,
              const std::string &file_name, const std::string &go_namespace)
      : BaseGenerator(parser, path, file_name, "" /* not used*/,
                      "" /* not used */, "go"),
        cur_name_space_(nullptr),
        namer_(WithFlagOptions(GoDefaultConfig(), parser.opts, path),
               GoKeywords()) {
    std::istringstream iss(go_namespace);
    std::string component;
    while (std::getline(iss, component, '.')) {
      go_namespace_.components.push_back(component);
    }
  }